

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O3

node_iterator * __thiscall
YAML::detail::node_data::end(node_iterator *__return_storage_ptr__,node_data *this)

{
  pointer ppnVar1;
  MapIter mapIt;
  
  if (this->m_isDefined != false) {
    if (this->m_type == Map) {
      mapIt._M_current =
           (this->m_map).
           super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      node_iterator_base<YAML::detail::node>::node_iterator_base(__return_storage_ptr__,mapIt,mapIt)
      ;
      return __return_storage_ptr__;
    }
    if (this->m_type == Sequence) {
      ppnVar1 = (this->m_sequence).
                super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      __return_storage_ptr__->m_type = Sequence;
      (__return_storage_ptr__->m_seqIt)._M_current = ppnVar1;
      (__return_storage_ptr__->m_mapIt)._M_current =
           (pair<YAML::detail::node_*,_YAML::detail::node_*> *)0x0;
      (__return_storage_ptr__->m_mapEnd)._M_current =
           (pair<YAML::detail::node_*,_YAML::detail::node_*> *)0x0;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->m_type = NoneType;
  (__return_storage_ptr__->m_seqIt)._M_current = (node **)0x0;
  (__return_storage_ptr__->m_mapIt)._M_current =
       (pair<YAML::detail::node_*,_YAML::detail::node_*> *)0x0;
  (__return_storage_ptr__->m_mapEnd)._M_current =
       (pair<YAML::detail::node_*,_YAML::detail::node_*> *)0x0;
  return __return_storage_ptr__;
}

Assistant:

node_iterator node_data::end() {
  if (!m_isDefined)
    return {};

  switch (m_type) {
    case NodeType::Sequence:
      return node_iterator(m_sequence.end());
    case NodeType::Map:
      return node_iterator(m_map.end(), m_map.end());
    default:
      return {};
  }
}